

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall
tinyusdz::Attribute::get_value<std::vector<float,std::allocator<float>>>
          (Attribute *this,vector<float,_std::allocator<float>_> *v)

{
  pointer pfVar1;
  pointer pfVar2;
  optional<std::vector<float,_std::allocator<float>_>_> local_30;
  
  if ((v != (vector<float,_std::allocator<float>_> *)0x0) &&
     (primvar::PrimVar::get_value<std::vector<float,std::allocator<float>>>(&local_30,&this->_var),
     local_30.has_value_ == true)) {
    pfVar1 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pfVar2 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data._M_start
         = (pointer)local_30.contained.data._0_8_;
    (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data._M_finish
         = (pointer)local_30.contained._8_8_;
    (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_30.contained._16_8_;
    if (pfVar1 == (pointer)0x0) {
      return true;
    }
    operator_delete(pfVar1,(long)pfVar2 - (long)pfVar1);
    return true;
  }
  return false;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }